

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O1

int areadfloat_part(char *file,int s_coeff,int e_coeff,float **data_ref,int *length_ref)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  size_t sVar4;
  float *__ptr;
  ulong uVar5;
  uint uVar6;
  size_t __nmemb;
  int dummy_length;
  undefined1 local_38 [4];
  int local_34;
  
  if (e_coeff < s_coeff) {
    __assert_fail("s_coeff <= e_coeff",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                  ,0x215,"int areadfloat_part(char *, int, int, float **, int *)");
  }
  iVar2 = strcmp(file,areadfloat_part::p_file);
  if (iVar2 == 0) {
LAB_0010573b:
    if (s_coeff < areadfloat_part::len) {
      if (areadfloat_part::len <= e_coeff) {
        areadfloat_part_cold_4();
        e_coeff = local_34;
      }
      uVar6 = 0;
      iVar2 = fseek((FILE *)areadfloat_part::fp,(long)s_coeff * 4 + 4,0);
      if (iVar2 < 0) {
        areadfloat_part_cold_5();
        __ptr = (float *)0x0;
        uVar3 = 0xffffffff;
      }
      else {
        if (areadfloat_part::len < e_coeff + 1) {
          __assert_fail("s_coeff + r_len <= len",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                        ,0x250,"int areadfloat_part(char *, int, int, float **, int *)");
        }
        uVar6 = (e_coeff - s_coeff) + 1;
        uVar3 = uVar6;
        if (data_ref == (float **)0x0) {
          if (length_ref == (int *)0x0) {
            return uVar6;
          }
          goto LAB_00105813;
        }
        __nmemb = (size_t)(int)uVar6;
        __ptr = (float *)calloc(__nmemb,4);
        sVar4 = fread(__ptr,4,__nmemb,(FILE *)areadfloat_part::fp);
        if (sVar4 == __nmemb) {
          if (-1 < e_coeff - s_coeff && areadfloat_part::byterev == 1) {
            uVar5 = 0;
            do {
              fVar1 = __ptr[uVar5];
              __ptr[uVar5] = (float)((uint)fVar1 >> 0x18 | ((uint)fVar1 & 0xff0000) >> 8 |
                                     ((uint)fVar1 & 0xff00) << 8 | (int)fVar1 << 0x18);
              uVar5 = uVar5 + 1;
            } while (uVar6 != uVar5);
          }
        }
        else {
          fprintf(_stderr,"areadfloat_part: unable to read %d coeff @ %d from %s\n",(ulong)uVar6,
                  (ulong)(uint)s_coeff,file);
          free(__ptr);
          __ptr = (float *)0x0;
          uVar6 = 0;
          uVar3 = 0xffffffff;
        }
      }
    }
    else {
      areadfloat_part_cold_3();
      __ptr = (float *)0x0;
      uVar6 = 0;
      uVar3 = 0;
    }
  }
  else {
    if (areadfloat_part::fp != (FILE *)0x0) {
      fclose((FILE *)areadfloat_part::fp);
    }
    areadfloat_part::len = get_length(file,&areadfloat_part::byterev);
    if (areadfloat_part::len < 0) {
      return -1;
    }
    __stream = fopen(file,"rb");
    areadfloat_part::fp = (FILE *)__stream;
    if (__stream == (FILE *)0x0) {
      areadfloat_part_cold_2();
    }
    else {
      strcpy(areadfloat_part::p_file,file);
      sVar4 = fread(local_38,4,1,__stream);
      if (sVar4 == 1) goto LAB_0010573b;
      areadfloat_part_cold_1();
    }
    __ptr = (float *)0x0;
    uVar6 = 0;
    uVar3 = 0xffffffff;
  }
  *data_ref = __ptr;
LAB_00105813:
  *length_ref = uVar6;
  return uVar3;
}

Assistant:

int
areadfloat_part (char *file,
                 int s_coeff,
                 int e_coeff,
                 float **data_ref,
                 int *length_ref)
{
    static char p_file[MAXPATHLEN] = "";
    static FILE *fp = NULL;
    static int len;
    static int byterev;
    int r_len;
    float *r_buf;
    int i;
    int dummy_length;

    assert(s_coeff <= e_coeff);
    if (strcmp(file, p_file) != 0) {
        if (fp) {
            fclose(fp);
        }
        /* Get the file length and whether the file needs to be
           byte-reversed */
        if ((len = get_length(file, &byterev)) < 0) {
            return -1;
        }
        fp = fopen(file, "rb");
        if (fp == NULL) {
            fprintf(stderr, "areadfloat_part: unable to open %s for reading;", file);
            perror("");
            *data_ref = NULL;
            *length_ref = 0;

            return -1;
        }
        strcpy(p_file, file);

        if (fread(&dummy_length, sizeof(int), 1, fp) != 1) {
            fprintf(stderr, "areadfloat_part: unable to read length from %s;", file);
            perror("");

            *data_ref = NULL;
            *length_ref = 0;

            return -1;
        }
    }

    if (s_coeff >= len) {
        fprintf(stderr, "areadfloat_part: start of data beyond end of file\n");
        *data_ref = NULL;
        *length_ref = 0;

        return 0;
    }

    if (e_coeff >= len) {
        fprintf(stderr, "areadfloat_part: end of data beyond end of file; resetting\n");

        e_coeff = len-1;
    }

    if (fseek(fp, s_coeff * sizeof(float) + sizeof(int), SEEK_SET) < 0) {
        fprintf(stderr, "areadfloat_part: seek fail;");
        perror("");
        fprintf(stderr, "offset == %zu in %s\n",
                s_coeff * sizeof(float) + sizeof(int), file);

        *data_ref = NULL;
        *length_ref = 0;
        return -1;
    }

    r_len = e_coeff - s_coeff + 1;

    assert(s_coeff + r_len <= len);
    /* Just get the file size if we were not given a buffer. */
    if (data_ref == NULL) {
        if (length_ref)
            *length_ref = r_len;
        return r_len;
    }

    r_buf = calloc(r_len, sizeof(float));
    if (fread(r_buf, sizeof(float), r_len, fp) != r_len) {
        fprintf(stderr, "areadfloat_part: unable to read %d coeff @ %d from %s\n",
                r_len, s_coeff, file);
        free(r_buf);
        *data_ref = NULL;
        *length_ref = 0;
        return -1;
    }

  if (byterev==1) 
    for (i = 0; i < r_len; i++) {
        MYSWAP_FLOAT(&r_buf[i]);
    }

    *data_ref = r_buf;
    *length_ref = r_len;

    return r_len;
}